

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fverify.c
# Opt level: O2

void fverify(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  float fversion;
  char infile [1025];
  
  memset(infile,0,0x401);
  c_ptaskn(task);
  __stream = (FILE *)0x0;
  if (prstat != 0) {
    __stream = _stdout;
  }
  wrtout((FILE *)__stream," ");
  ffvers(&fversion);
  sprintf(comm,"%s (CFITSIO V%.3f)",SUB84((double)fversion,0),task);
  wrtsep((FILE *)__stream,' ',comm,0x4b);
  for (pcVar2 = comm; *pcVar2 != '\0'; pcVar2 = pcVar2 + 1) {
    *pcVar2 = '-';
  }
  wrtsep((FILE *)__stream,' ',comm,0x4b);
  wrtout((FILE *)__stream," ");
  if (err_report == 2) {
    builtin_strncpy(comm + 0x10,"ecking for the most severe FITS format errors.",0x2f);
    builtin_strncpy(comm,"Caution: Only ch",0x10);
    wrtout((FILE *)__stream,comm);
  }
  if (heasarc_conv != 0) {
    builtin_strncpy(comm,"HEASARC conventions are being checked.",0x27);
    wrtout((FILE *)__stream,comm);
  }
  iVar1 = verify_fits(infile,(FILE *)__stream);
  if (__stream == (FILE *)0x0) {
    if (iVar1 == 0) {
      iVar1 = get_total_err();
    }
    else {
      iVar1 = 1;
    }
    printf("verification %s: %-20s  nerrors=%d\n",
           &DAT_001c20b0 + *(int *)(&DAT_001c20b0 + (ulong)(0 < iVar1) * 4),infile);
  }
  if ((__stream != (FILE *)0x0) && (__stream != _stdout)) {
    fclose(__stream);
  }
  return;
}

Assistant:

void fverify()
{ 
    char infile[FLEN_FILENAME] = "";  	/* Input Fits file */
    char outfile[FLEN_FILENAME] = "";  	/* output ASCII file */
    char *p;
    int status = 0, vfstatus = 0, filestatus, ferror, fwarn;
    int i, nerrs; 
    FILE* list = NULL;
    FILE *out;				/* output ASCII file pointer */
    float fversion;
    char *status_str[] = {"OK    ", "FAILED"};

    /*------------------Initialization  --------------------------------*/

    c_ptaskn(task);

    /* get the input parameters from parameter file*/
    if(init_fverify(infile, outfile, &status) ) {
        strcpy(errmes,"Errors in init_fverfify.");
        c_fcerr(errmes);
	leave_early(NULL);
	return;
    } 

    /* if infile name has @ in front of it, then it is a file of a list */ 
    p = infile; 
    if (*p == '@') { 
         p++;
	 if( (list = fopen(p,"r")) == NULL ) { 
	        sprintf(errmes,
		    "Can not open the list file: %s.",p);
                c_fcerr(errmes);
	        leave_early(NULL);
		return;
         } 
    }     

    /* if the outfile is given, open it, otherwise, use stdout */
    p = outfile;
    if(*p == '!') { 
	p++;
    } 
    else { 
        if(prstat && strlen(p) && strcmp(p, "STDOUT")) { 
	    if( (out = fopen(p,"r")) != NULL ) { 
	        sprintf(errmes,
		    "Clobber is not set. Can not overwrite the file %s.",p);
                c_fcerr(errmes);
	        leave_early(NULL);
		fclose(out);
		return;
            }
        }
    }

    if(prstat && (!strlen(p) || !strcmp(p, "STDOUT"))) {  
	out = stdout;
    }
    else if (!prstat) {
       out=NULL;
    }  
    else if( (out = fopen(p,"w") ) == NULL) {
            sprintf(errmes,
               "Error opening Ouputput file %s. Using stdout instead.",
	       outfile);
            c_fcerr(errmes);
	    out = stdout;
    }

    wrtout(out," ");
    fits_get_version(&fversion);
    sprintf(comm,"%s (CFITSIO V%.3f)",task,fversion);
    wrtsep(out,' ',comm,75);
    for(i = 0; comm[i]!='\0'; i++) comm[i] = '-';
    wrtsep(out,' ',comm,75);
    wrtout(out," ");
    switch (err_report) {
    case 2:
    sprintf(comm, "Caution: Only checking for the most severe FITS format errors.");
        wrtout(out,comm);
        break;
    case 1:
        break;
    case 0:
        break;
    }

    if(heasarc_conv) {
        sprintf(comm, "HEASARC conventions are being checked.");
	wrtout(out,comm);
    }     

    /* process each file */ 
    if (list == NULL) { 
        vfstatus = verify_fits(infile,out);  

        if (out == NULL) {  /* print one-line file summary */

           /* verify_fits returns a non-zero status for catastrophic
            * file I/O problems (an abort), and in this case total_err
            * is not updated via close_report(), so we need to set
            * nerrs accordingly for the one-line file summary. */
           if (vfstatus) nerrs = 1; else nerrs = get_total_err();

           filestatus = (nerrs>0) ? 1 : 0;
           printf("verification %s: %-20s  nerrors=%d\n", status_str[filestatus],
                   infile, nerrs); 
        }        
    } 
    else { 
       while((p = fgets(infile, FLEN_FILENAME, list))!= NULL) {      
           vfstatus = verify_fits(infile,out);   

           if (out == NULL) { /* print one-line file summary */

              /* verify_fits returns a non-zero status for catastrophic
               * file I/O problems (an abort), and in this case total_err
               * is not updated via close_report(), so we need to set
               * nerrs accordingly for the one-line file summary. */
              if (vfstatus) nerrs = 1; else nerrs = get_total_err();

              filestatus = (nerrs>0) ? 1 : 0;
              printf("verification %s: %-20s  nerrors=%d\n",
                 status_str[filestatus], infile, nerrs); 
           }        

           for (i = 1; i < 3; i++) wrtout(out," ");
       }
       fclose(list);
    }        
 
    /* close the output file  */ 
    if (out != stdout && out != NULL) fclose(out);

    return;
}